

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O3

string * cmTrimWhitespace_abi_cxx11_(string *__return_storage_ptr__,string_view str)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  
  pcVar4 = str._M_str;
  sVar5 = str._M_len;
  if (sVar5 != 0) {
    pcVar1 = pcVar4 + sVar5;
    do {
      if ((*pcVar4 < '\0') || (iVar2 = isspace((int)*pcVar4), iVar2 == 0)) goto LAB_00121371;
      pcVar4 = pcVar4 + 1;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
  while( true ) {
    iVar2 = isspace((int)pcVar3[-1]);
    pcVar1 = pcVar3 + -1;
    if (iVar2 == 0) break;
LAB_00121371:
    pcVar3 = pcVar1;
    if (pcVar3[-1] < 0) break;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTrimWhitespace(cm::string_view str)
{
  // XXX(clang-tidy): This declaration and the next cannot be `const auto*`
  // because the qualification of `auto` is platform-dependent.
  // NOLINTNEXTLINE(readability-qualified-auto)
  auto start = str.begin();
  while (start != str.end() && cmIsSpace(*start)) {
    ++start;
  }
  if (start == str.end()) {
    return std::string();
  }
  // NOLINTNEXTLINE(readability-qualified-auto)
  auto stop = str.end() - 1;
  while (cmIsSpace(*stop)) {
    --stop;
  }
  return std::string(start, stop + 1);
}